

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_changedir(LispPTR *args)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar8;
  DLword *pDVar9;
  char *pcVar10;
  long lVar11;
  char host [255];
  char lfname [4101];
  char dir [4096];
  undefined4 local_2138;
  char local_2134;
  char local_2038 [4112];
  char local_1028 [4096];
  long lVar7;
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 == 0) {
    Lisp_errno = &Dummy_errno;
    uVar3 = *args;
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    if ((char)Lisp_world[(ulong)uVar3 + 3] == 'D') {
      iVar5 = *(int *)(Lisp_world + (ulong)uVar3 + 4) * 2;
      iVar6 = 5;
    }
    else if ((char)Lisp_world[(ulong)uVar3 + 3] == 'C') {
      iVar5 = *(int *)(Lisp_world + (ulong)uVar3 + 4);
      iVar6 = 3;
    }
    else {
      iVar5 = error("LispStringLength: Not a character array.\n");
      iVar6 = 5;
    }
    if (iVar5 + iVar6 < 0x1006) {
      uVar3 = *args;
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      iVar5 = *(int *)(Lisp_world + (ulong)uVar3 + 4);
      iVar6 = 0x1000;
      if (iVar5 < 0x1000) {
        iVar6 = iVar5;
      }
      lVar7 = (long)iVar6;
      if ((char)Lisp_world[(ulong)uVar3 + 3] == 'D') {
        if (iVar5 == 0) {
          pcVar10 = local_2038;
        }
        else {
          lVar7 = lVar7 + (ulong)(lVar7 == 0);
          pDVar9 = Lisp_world +
                   (ulong)Lisp_world[(ulong)uVar3 + 2] +
                   (ulong)(*(uint *)(Lisp_world + uVar3) & 0xfffffff);
          pcVar10 = local_2038;
          do {
            *pcVar10 = *(char *)((ulong)pDVar9 ^ 2);
            pcVar10 = pcVar10 + 1;
            pDVar9 = pDVar9 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        *pcVar10 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar3 + 3] == 'C') {
        if (iVar5 != 0) {
          uVar4 = *(uint *)(Lisp_world + uVar3);
          uVar2 = Lisp_world[(ulong)uVar3 + 2];
          lVar11 = 0;
          do {
            local_2038[lVar11] =
                 *(char *)((long)Lisp_world + lVar11 + (ulong)uVar2 + (ulong)(uVar4 & 0xfffffff) * 2
                          ^ 3);
            lVar11 = lVar11 + 1;
          } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
        }
        local_2038[lVar7] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(local_2038,(char *)&local_2138);
      cVar1 = (char)local_2138;
      pcVar10 = (char *)&local_2138;
      while (cVar1 != '\0') {
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          *pcVar10 = cVar1 + -0x20;
        }
        cVar1 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      }
      if ((local_2138 != 0x4b5344) && (local_2134 != '\0' || local_2138 != 0x58494e55)) {
        return 0;
      }
      iVar5 = unixpathname(local_2038,local_1028,0,0);
      if (iVar5 == 0) {
        return 0;
      }
      if ((local_2138 == 0x4b5344) && (iVar5 = true_name(local_1028), iVar5 != -1)) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        iVar5 = chdir(local_1028);
        if (iVar5 != -1) break;
      } while (*piVar8 == 4);
      alarm(0);
      if (iVar5 == 0) {
        return 0x4c;
      }
      return 0;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_changedir(LispPTR *args)
{
  int dskp, rval;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, dir, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, dir, 0, 0)) return (NIL);
#endif /* DOS */

  if (dskp) {
    /*
     * If {DSK} device, the directory name can be specified in a case
     * insensitive manner.  We have to convert it into a right case.
     */
    if (true_name(dir) != -1) return (NIL);
  }

  TIMEOUT(rval = chdir(dir));
  if (rval != 0) return (NIL);
#ifdef DOS
  if (*drive) {
    if (*drive <= 'Z')
      rval = _chdrive(*drive - ('A' - 1));
    else
      rval = _chdrive(*drive - ('a' - 1));
    if (rval != 0) return (NIL);
  }
#endif /* DOS */
  return (ATOM_T);
}